

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O1

uchar * stbi_zlib_compress(uchar *data,int data_len,int *out_len,int quality)

{
  byte *pbVar1;
  void **arr;
  byte bVar2;
  void *__dest;
  long lVar3;
  long lVar4;
  bool bVar5;
  int *piVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uchar *puVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  int itemsize;
  int iVar14;
  int extraout_EDX;
  uint extraout_EDX_00;
  uint uVar15;
  void *pvVar16;
  uint uVar17;
  int res_3;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  int iVar23;
  int local_90;
  uint local_8c;
  uchar *local_88;
  ulong local_80;
  void *local_78;
  uchar *local_70;
  int local_68;
  int local_64;
  ulong local_60;
  ulong local_58;
  int *local_50;
  size_t local_48;
  ulong local_40;
  long local_38;
  
  local_8c = 0;
  local_90 = 0;
  local_88 = (uchar *)0x0;
  local_78 = malloc(0x20000);
  if (local_78 == (void *)0x0) {
    return (uchar *)0x0;
  }
  local_60 = 5;
  if (5 < quality) {
    local_60 = (ulong)(uint)quality;
  }
  local_80 = (ulong)(uint)data_len;
  local_50 = out_len;
  stbiw__sbgrowf(&local_88,1,itemsize);
  iVar23 = *(int *)(local_88 + -4);
  iVar14 = iVar23 + 1;
  *(int *)(local_88 + -4) = iVar14;
  local_88[iVar23] = 'x';
  if ((local_88 == (uchar *)0x0) || (*(int *)(local_88 + -8) <= *(int *)(local_88 + -4) + 1)) {
    stbiw__sbgrowf(&local_88,1,iVar14);
  }
  iVar23 = *(int *)(local_88 + -4);
  *(int *)(local_88 + -4) = iVar23 + 1;
  local_88[iVar23] = '^';
  local_8c = 1;
  local_90 = 1;
  local_88 = stbiw__zlib_flushf(local_88,&local_8c,&local_90);
  local_8c = local_8c | 1 << ((byte)local_90 & 0x1f);
  local_90 = local_90 + 2;
  local_88 = stbiw__zlib_flushf(local_88,&local_8c,&local_90);
  pvVar16 = local_78;
  uVar7 = 0;
  local_70 = local_88;
  memset(local_78,0,0x20000);
  if (3 < (int)local_80) {
    local_64 = (int)local_80 + -3;
    local_68 = (int)local_60 * 2;
    local_40 = local_60 & 0xffffffff;
    local_48 = local_40 * 8;
    uVar9 = 0;
    do {
      iVar23 = (int)uVar9;
      local_38 = (long)iVar23;
      uVar7 = (uint)CONCAT12(data[local_38 + 2],*(undefined2 *)(data + local_38)) * 8 ^
              (uint)CONCAT12(data[local_38 + 2],*(undefined2 *)(data + local_38));
      uVar7 = (uVar7 >> 5) + uVar7;
      uVar7 = uVar7 * 0x10 ^ uVar7;
      uVar7 = (uVar7 >> 0x11) + uVar7;
      uVar19 = (ulong)((uVar7 >> 6) + uVar7 & 0x3fff);
      __dest = *(void **)((long)pvVar16 + uVar19 * 8);
      uVar7 = 0;
      if (__dest != (void *)0x0) {
        uVar7 = *(uint *)((long)__dest + -4);
      }
      pbVar1 = data + local_38;
      iVar14 = (int)local_80;
      if ((int)uVar7 < 1) {
        iVar13 = 3;
        lVar22 = 0;
      }
      else {
        iVar14 = iVar14 - iVar23;
        uVar17 = iVar14 - 1;
        if (0x100 < uVar17) {
          uVar17 = 0x101;
        }
        iVar13 = 3;
        uVar18 = 0;
        lVar22 = 0;
        do {
          lVar3 = *(long *)((long)__dest + uVar18 * 8);
          if ((long)(iVar23 + -0x8000) < lVar3 - (long)data) {
            uVar21 = 0;
            if (0 < iVar14) {
              do {
                if (*(byte *)(lVar3 + uVar21) != pbVar1[uVar21]) goto LAB_00136f24;
                uVar21 = uVar21 + 1;
              } while (uVar17 + 1 != uVar21);
              uVar21 = (ulong)(uVar17 + 1);
            }
LAB_00136f24:
            iVar20 = (int)uVar21;
            iVar12 = iVar13;
            if (iVar13 < iVar20) {
              iVar12 = iVar20;
            }
            bVar5 = iVar13 <= iVar20;
            iVar13 = iVar12;
            if (bVar5) {
              lVar22 = lVar3;
            }
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar7);
      }
      arr = (void **)((long)pvVar16 + uVar19 * 8);
      local_58 = uVar9;
      if (__dest == (void *)0x0) {
LAB_00136f82:
        stbiw__sbgrowf(arr,8,iVar14);
      }
      else {
        if (*(int *)((long)__dest + -4) == local_68) {
          memmove(__dest,(void *)((long)__dest + local_40 * 8),local_48);
          *(int *)((long)__dest + -4) = (int)local_60;
          iVar14 = extraout_EDX;
        }
        if ((__dest == (void *)0x0) ||
           (*(int *)((long)__dest + -8) <= *(int *)((long)__dest + -4) + 1)) goto LAB_00136f82;
      }
      pvVar16 = *arr;
      iVar23 = *(int *)((long)pvVar16 + -4);
      *(int *)((long)pvVar16 + -4) = iVar23 + 1;
      *(byte **)((long)pvVar16 + (long)iVar23 * 8) = pbVar1;
      if (lVar22 == 0) {
        lVar22 = 0;
      }
      else {
        uVar7 = (uint)*(uint3 *)(pbVar1 + 1) * 8 ^ (uint)*(uint3 *)(pbVar1 + 1);
        uVar7 = (uVar7 >> 5) + uVar7;
        uVar7 = uVar7 * 0x10 ^ uVar7;
        uVar7 = (uVar7 >> 0x11) + uVar7;
        lVar3 = *(long *)((long)local_78 + (ulong)((uVar7 >> 6) + uVar7 & 0x3fff) * 8);
        if (lVar3 == 0) {
          uVar9 = 0;
        }
        else {
          uVar9 = (ulong)*(uint *)(lVar3 + -4);
        }
        if (0 < (int)uVar9) {
          uVar17 = ~(uint)local_58;
          uVar7 = (uVar17 + (int)local_80) - 1;
          if (0x100 < uVar7) {
            uVar7 = 0x101;
          }
          uVar19 = 0;
          do {
            lVar4 = *(long *)(lVar3 + uVar19 * 8);
            if ((long)(int)((uint)local_58 - 0x7fff) < lVar4 - (long)data) {
              uVar18 = 0;
              if (0 < (int)(uVar17 + (int)local_80)) {
                do {
                  if (*(uchar *)(lVar4 + uVar18) != data[uVar18 + local_38 + 1]) goto LAB_00137076;
                  uVar18 = uVar18 + 1;
                } while (uVar7 + 1 != uVar18);
                uVar18 = (ulong)(uVar7 + 1);
              }
LAB_00137076:
              if (iVar13 < (int)uVar18) {
                lVar22 = 0;
                break;
              }
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar9);
        }
      }
      bVar11 = (byte)local_90;
      if (lVar22 == 0) {
        bVar2 = *pbVar1;
        if (bVar2 < 0x90) {
          uVar7 = bVar2 + 0x30;
          iVar23 = 0;
          iVar14 = -8;
          do {
            iVar23 = (uVar7 & 1) + iVar23 * 2;
            uVar7 = uVar7 >> 1;
            iVar14 = iVar14 + 1;
          } while (iVar14 != 0);
          uVar7 = iVar23 << (bVar11 & 0x1f);
          local_90 = local_90 + 8;
        }
        else {
          uVar7 = bVar2 | 0x100;
          iVar23 = 0;
          iVar14 = -9;
          do {
            iVar23 = (uVar7 & 1) + iVar23 * 2;
            uVar7 = uVar7 >> 1;
            iVar14 = iVar14 + 1;
          } while (iVar14 != 0);
          uVar7 = iVar23 << (bVar11 & 0x1f);
          local_90 = local_90 + 9;
        }
        local_8c = local_8c | uVar7;
        iVar13 = 1;
        pvVar16 = local_78;
        puVar10 = local_70;
LAB_001372b1:
        puVar10 = stbiw__zlib_flushf(puVar10,&local_8c,&local_90);
      }
      else {
        iVar23 = (int)pbVar1 - (int)lVar22;
        if ((0x7fff < iVar23) || (0x102 < iVar13)) {
          local_88 = local_70;
          __assert_fail("d <= 32767 && best <= 258",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/stb/stb_image_write.h"
                        ,0x36c,"unsigned char *stbi_zlib_compress(unsigned char *, int, int *, int)"
                       );
        }
        uVar9 = 0;
        do {
          uVar19 = uVar9;
          uVar9 = uVar19 + 1;
        } while ((int)(uint)stbi_zlib_compress::lengthc[uVar19 + 1] <= iVar13);
        if (uVar19 < 0x17) {
          iVar14 = 0;
          iVar12 = -7;
          do {
            iVar14 = ((uint)uVar9 & 1) + iVar14 * 2;
            uVar9 = (ulong)((uint)uVar9 >> 1);
            iVar12 = iVar12 + 1;
          } while (iVar12 != 0);
          uVar7 = iVar14 << (bVar11 & 0x1f);
          local_90 = local_90 + 7;
        }
        else {
          uVar7 = (int)uVar9 + 0xa8;
          iVar14 = 0;
          iVar12 = -8;
          do {
            iVar14 = (uVar7 & 1) + iVar14 * 2;
            uVar7 = uVar7 >> 1;
            iVar12 = iVar12 + 1;
          } while (iVar12 != 0);
          uVar7 = iVar14 << (bVar11 & 0x1f);
          local_90 = local_90 + 8;
        }
        local_8c = local_8c | uVar7;
        puVar10 = stbiw__zlib_flushf(local_70,&local_8c,&local_90);
        uVar19 = uVar19 & 0xffffffff;
        if (0xffffffffffffffeb < uVar19 - 0x1c) {
          local_8c = local_8c |
                     iVar13 - (uint)stbi_zlib_compress::lengthc[uVar19] << ((byte)local_90 & 0x1f);
          local_90 = (uint)""[uVar19] + local_90;
          puVar10 = stbiw__zlib_flushf(puVar10,&local_8c,&local_90);
        }
        pvVar16 = local_78;
        uVar9 = 0xffffffffffffffff;
        do {
          lVar22 = uVar9 + 2;
          uVar9 = uVar9 + 1;
        } while ((int)(uint)stbi_zlib_compress::distc[lVar22] <= iVar23);
        iVar14 = 0;
        iVar12 = -5;
        uVar19 = uVar9 & 0xffffffff;
        do {
          iVar14 = ((uint)uVar19 & 1) + iVar14 * 2;
          uVar19 = uVar19 >> 1;
          iVar12 = iVar12 + 1;
        } while (iVar12 != 0);
        local_8c = local_8c | iVar14 << ((byte)local_90 & 0x1f);
        local_90 = local_90 + 5;
        puVar10 = stbiw__zlib_flushf(puVar10,&local_8c,&local_90);
        if (3 < uVar9) {
          local_8c = local_8c |
                     iVar23 - (uint)stbi_zlib_compress::distc[uVar9 & 0xffffffff] <<
                     ((byte)local_90 & 0x1f);
          local_90 = (uint)""[uVar9 & 0xffffffff] + local_90;
          goto LAB_001372b1;
        }
      }
      uVar7 = iVar13 + (int)local_58;
      uVar9 = (ulong)uVar7;
      local_70 = puVar10;
    } while ((int)uVar7 < local_64);
  }
  local_88 = local_70;
  iVar23 = (int)local_80;
  puVar10 = local_70;
  if ((int)uVar7 < (int)local_80) {
    lVar22 = (long)(int)uVar7;
    do {
      bVar11 = data[lVar22];
      if (bVar11 < 0x90) {
        uVar7 = bVar11 + 0x30;
        iVar14 = 0;
        iVar13 = -8;
        do {
          iVar14 = (uVar7 & 1) + iVar14 * 2;
          uVar7 = uVar7 >> 1;
          iVar13 = iVar13 + 1;
        } while (iVar13 != 0);
        uVar7 = iVar14 << ((byte)local_90 & 0x1f);
        local_90 = local_90 + 8;
      }
      else {
        uVar7 = bVar11 | 0x100;
        iVar14 = 0;
        iVar13 = -9;
        do {
          iVar14 = (uVar7 & 1) + iVar14 * 2;
          uVar7 = uVar7 >> 1;
          iVar13 = iVar13 + 1;
        } while (iVar13 != 0);
        uVar7 = iVar14 << ((byte)local_90 & 0x1f);
        local_90 = local_90 + 9;
      }
      local_8c = local_8c | uVar7;
      puVar10 = stbiw__zlib_flushf(puVar10,&local_8c,&local_90);
      lVar22 = lVar22 + 1;
    } while ((int)lVar22 != iVar23);
  }
  local_90 = local_90 + 7;
  local_88 = puVar10;
  puVar10 = stbiw__zlib_flushf(puVar10,&local_8c,&local_90);
  if (local_90 != 0) {
    do {
      local_90 = local_90 + 1;
      puVar10 = stbiw__zlib_flushf(puVar10,&local_8c,&local_90);
    } while (local_90 != 0);
  }
  piVar6 = local_50;
  pvVar16 = local_78;
  uVar9 = local_80;
  lVar22 = 0;
  local_88 = puVar10;
  do {
    lVar3 = *(long *)((long)pvVar16 + lVar22 * 8);
    if (lVar3 != 0) {
      free((void *)(lVar3 + -8));
    }
    lVar22 = lVar22 + 1;
  } while (lVar22 != 0x4000);
  free(pvVar16);
  iVar23 = (int)uVar9;
  if (iVar23 < 1) {
    uVar17 = 0;
    uVar15 = 1;
    uVar7 = extraout_EDX_00;
  }
  else {
    uVar8 = iVar23 + (int)((uVar9 & 0xffffffff) / 0x15b0) * -0x15b0;
    uVar15 = 1;
    uVar17 = 0;
    uVar9 = 0;
    do {
      if (uVar8 != 0) {
        uVar19 = 0;
        do {
          uVar15 = uVar15 + data[uVar19 + uVar9];
          uVar17 = uVar17 + uVar15;
          uVar19 = uVar19 + 1;
        } while (uVar8 != uVar19);
        uVar15 = uVar15 % 0xfff1;
        uVar17 = uVar17 % 0xfff1;
      }
      uVar7 = (int)uVar9 + uVar8;
      uVar9 = (ulong)uVar7;
      uVar8 = 0x15b0;
    } while ((int)uVar7 < iVar23);
  }
  if ((puVar10 == (uchar *)0x0) || (*(int *)(puVar10 + -8) <= *(int *)(puVar10 + -4) + 1)) {
    stbiw__sbgrowf(&local_88,1,uVar7);
  }
  iVar23 = *(int *)(local_88 + -4);
  iVar14 = iVar23 + 1;
  *(int *)(local_88 + -4) = iVar14;
  local_88[iVar23] = (uchar)(uVar17 >> 8);
  if ((local_88 == (uchar *)0x0) || (*(int *)(local_88 + -8) <= *(int *)(local_88 + -4) + 1)) {
    stbiw__sbgrowf(&local_88,1,iVar14);
  }
  iVar23 = *(int *)(local_88 + -4);
  iVar14 = iVar23 + 1;
  *(int *)(local_88 + -4) = iVar14;
  local_88[iVar23] = (uchar)uVar17;
  if ((local_88 == (uchar *)0x0) || (*(int *)(local_88 + -8) <= *(int *)(local_88 + -4) + 1)) {
    stbiw__sbgrowf(&local_88,1,iVar14);
  }
  iVar23 = *(int *)(local_88 + -4);
  iVar14 = iVar23 + 1;
  *(int *)(local_88 + -4) = iVar14;
  local_88[iVar23] = (uchar)(uVar15 >> 8);
  if ((local_88 == (uchar *)0x0) || (*(int *)(local_88 + -8) <= *(int *)(local_88 + -4) + 1)) {
    stbiw__sbgrowf(&local_88,1,iVar14);
  }
  iVar23 = *(int *)(local_88 + -4);
  *(int *)(local_88 + -4) = iVar23 + 1;
  local_88[iVar23] = (uchar)uVar15;
  iVar23 = *(int *)(local_88 + -4);
  *piVar6 = iVar23;
  puVar10 = (uchar *)memmove(local_88 + -8,local_88,(long)iVar23);
  return puVar10;
}

Assistant:

unsigned char * stbi_zlib_compress(unsigned char *data, int data_len, int *out_len, int quality)
{
#ifdef STBIW_ZLIB_COMPRESS
   // user provided a zlib compress implementation, use that
   return STBIW_ZLIB_COMPRESS(data, data_len, out_len, quality);
#else // use builtin
   static unsigned short lengthc[] = { 3,4,5,6,7,8,9,10,11,13,15,17,19,23,27,31,35,43,51,59,67,83,99,115,131,163,195,227,258, 259 };
   static unsigned char  lengtheb[]= { 0,0,0,0,0,0,0, 0, 1, 1, 1, 1, 2, 2, 2, 2, 3, 3, 3, 3, 4, 4, 4,  4,  5,  5,  5,  5,  0 };
   static unsigned short distc[]   = { 1,2,3,4,5,7,9,13,17,25,33,49,65,97,129,193,257,385,513,769,1025,1537,2049,3073,4097,6145,8193,12289,16385,24577, 32768 };
   static unsigned char  disteb[]  = { 0,0,0,0,1,1,2,2,3,3,4,4,5,5,6,6,7,7,8,8,9,9,10,10,11,11,12,12,13,13 };
   unsigned int bitbuf=0;
   int i,j, bitcount=0;
   unsigned char *out = NULL;
   unsigned char ***hash_table = (unsigned char***) STBIW_MALLOC(stbiw__ZHASH * sizeof(char**));
   if (hash_table == NULL)
      return NULL;
   if (quality < 5) quality = 5;

   stbiw__sbpush(out, 0x78);   // DEFLATE 32K window
   stbiw__sbpush(out, 0x5e);   // FLEVEL = 1
   stbiw__zlib_add(1,1);  // BFINAL = 1
   stbiw__zlib_add(1,2);  // BTYPE = 1 -- fixed huffman

   for (i=0; i < stbiw__ZHASH; ++i)
      hash_table[i] = NULL;

   i=0;
   while (i < data_len-3) {
      // hash next 3 bytes of data to be compressed
      int h = stbiw__zhash(data+i)&(stbiw__ZHASH-1), best=3;
      unsigned char *bestloc = 0;
      unsigned char **hlist = hash_table[h];
      int n = stbiw__sbcount(hlist);
      for (j=0; j < n; ++j) {
         if (hlist[j]-data > i-32768) { // if entry lies within window
            int d = stbiw__zlib_countm(hlist[j], data+i, data_len-i);
            if (d >= best) best=d,bestloc=hlist[j];
         }
      }
      // when hash table entry is too long, delete half the entries
      if (hash_table[h] && stbiw__sbn(hash_table[h]) == 2*quality) {
         STBIW_MEMMOVE(hash_table[h], hash_table[h]+quality, sizeof(hash_table[h][0])*quality);
         stbiw__sbn(hash_table[h]) = quality;
      }
      stbiw__sbpush(hash_table[h],data+i);

      if (bestloc) {
         // "lazy matching" - check match at *next* byte, and if it's better, do cur byte as literal
         h = stbiw__zhash(data+i+1)&(stbiw__ZHASH-1);
         hlist = hash_table[h];
         n = stbiw__sbcount(hlist);
         for (j=0; j < n; ++j) {
            if (hlist[j]-data > i-32767) {
               int e = stbiw__zlib_countm(hlist[j], data+i+1, data_len-i-1);
               if (e > best) { // if next match is better, bail on current match
                  bestloc = NULL;
                  break;
               }
            }
         }
      }

      if (bestloc) {
         int d = (int) (data+i - bestloc); // distance back
         STBIW_ASSERT(d <= 32767 && best <= 258);
         for (j=0; best > lengthc[j+1]-1; ++j);
         stbiw__zlib_huff(j+257);
         if (lengtheb[j]) stbiw__zlib_add(best - lengthc[j], lengtheb[j]);
         for (j=0; d > distc[j+1]-1; ++j);
         stbiw__zlib_add(stbiw__zlib_bitrev(j,5),5);
         if (disteb[j]) stbiw__zlib_add(d - distc[j], disteb[j]);
         i += best;
      } else {
         stbiw__zlib_huffb(data[i]);
         ++i;
      }
   }
   // write out final bytes
   for (;i < data_len; ++i)
      stbiw__zlib_huffb(data[i]);
   stbiw__zlib_huff(256); // end of block
   // pad with 0 bits to byte boundary
   while (bitcount)
      stbiw__zlib_add(0,1);

   for (i=0; i < stbiw__ZHASH; ++i)
      (void) stbiw__sbfree(hash_table[i]);
   STBIW_FREE(hash_table);

   {
      // compute adler32 on input
      unsigned int s1=1, s2=0;
      int blocklen = (int) (data_len % 5552);
      j=0;
      while (j < data_len) {
         for (i=0; i < blocklen; ++i) s1 += data[j+i], s2 += s1;
         s1 %= 65521, s2 %= 65521;
         j += blocklen;
         blocklen = 5552;
      }
      stbiw__sbpush(out, STBIW_UCHAR(s2 >> 8));
      stbiw__sbpush(out, STBIW_UCHAR(s2));
      stbiw__sbpush(out, STBIW_UCHAR(s1 >> 8));
      stbiw__sbpush(out, STBIW_UCHAR(s1));
   }
   *out_len = stbiw__sbn(out);
   // make returned pointer freeable
   STBIW_MEMMOVE(stbiw__sbraw(out), out, *out_len);
   return (unsigned char *) stbiw__sbraw(out);
#endif // STBIW_ZLIB_COMPRESS
}